

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

iterator __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
::find<char[2]>(raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                *this,key_arg<char[2]> *key)

{
  size_t hashval;
  iterator iVar1;
  key_arg<char[2]> *key_local;
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  *this_local;
  
  hashval = hash<char[2]>(this,key);
  iVar1 = find<char[2]>(this,key,hashval);
  return iVar1;
}

Assistant:

iterator find(const key_arg<K>& key) {
        return find(key, this->hash(key));
    }